

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerSRGBDecodeCase::test
          (SamplerSRGBDecodeCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  bool bVar1;
  deBool dVar2;
  TestLog *pTVar3;
  Enum<int,_2UL> EVar4;
  bool local_779;
  GetNameFunc local_768;
  int local_760;
  string local_758;
  allocator<char> local_731;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  GLenum local_6ac;
  GetNameFunc p_Stack_6a8;
  deUint32 err_7;
  int local_6a0;
  GetNameFunc local_698;
  int local_690;
  string local_688;
  allocator<char> local_661;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  GLenum local_5dc;
  GLuint local_5d8;
  deUint32 err_6;
  GLuint decode_1;
  GLuint skipDecode_1;
  int local_5c8;
  GetNameFunc local_5c0;
  int local_5b8;
  string local_5b0;
  allocator<char> local_589;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  GLenum local_504;
  GetNameFunc p_Stack_500;
  deUint32 err_5;
  int local_4f8;
  GetNameFunc local_4f0;
  int local_4e8;
  string local_4e0;
  allocator<char> local_4b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  GLenum local_434;
  GLint local_430;
  deUint32 err_4;
  GLint decode;
  GLint skipDecode;
  int local_420;
  GetNameFunc local_418;
  int local_410;
  string local_408;
  allocator<char> local_3e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  GLenum local_35c;
  GetNameFunc p_Stack_358;
  deUint32 err_3;
  int local_350;
  GetNameFunc local_348;
  int local_340;
  string local_338;
  allocator<char> local_311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  GLenum local_28c;
  GetNameFunc p_Stack_288;
  deUint32 err_2;
  int local_280;
  GetNameFunc local_278;
  int local_270;
  string local_268;
  allocator<char> local_241;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  GLenum local_1bc;
  GetNameFunc p_Stack_1b8;
  deUint32 err_1;
  int local_1b0;
  GetNameFunc local_1a8;
  int local_1a0;
  string local_198;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  GLenum local_f0;
  GLfloat local_ec;
  deUint32 err;
  GLfloat decodeFloat;
  GLint decodeInt;
  allocator<char> local_b9;
  string local_b8;
  ScopedLogSection local_98;
  ScopedLogSection section_1;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ScopedLogSection local_30;
  ScopedLogSection section;
  bool isPureCase;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  SamplerSRGBDecodeCase *this_local;
  
  bVar1 = isPureIntTester((this->super_SamplerTest).m_tester);
  local_779 = true;
  if (!bVar1) {
    local_779 = isPureUintTester((this->super_SamplerTest).m_tester);
  }
  section.m_log._7_1_ = local_779;
  if (local_779 == false) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Initial",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Initial",(allocator<char> *)((long)&section_1.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_30,pTVar3,&local_50,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49
               ,(this->super_SamplerTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_30);
  }
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Toggle",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&decodeInt,"Toggle",(allocator<char> *)((long)&decodeFloat + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar3,&local_b8,(string *)&decodeInt);
  std::__cxx11::string::~string((string *)&decodeInt);
  std::allocator<char>::~allocator((allocator<char> *)((long)&decodeFloat + 3));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  err = 0x8a49;
  local_ec = 35401.0;
  glu::CallLogWrapper::glSamplerParameteri
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a);
  do {
    local_f0 = glu::CallLogWrapper::glGetError(gl);
    if (local_f0 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_170,"Got Error ",&local_171);
      EVar4 = glu::getErrorStr(local_f0);
      p_Stack_1b8 = EVar4.m_getName;
      local_1b0 = EVar4.m_value;
      local_1a8 = p_Stack_1b8;
      local_1a0 = local_1b0;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_198,&local_1a8);
      std::operator+(&local_150,&local_170,&local_198);
      std::operator+(&local_130,&local_150,": ");
      std::operator+(&local_110,&local_130,"set state");
      tcu::ResultCollector::fail(result,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_170);
      std::allocator<char>::~allocator(&local_171);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a,
             (this->super_SamplerTest).m_type);
  glu::CallLogWrapper::glSamplerParameteriv
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,(GLint *)&err);
  do {
    local_1bc = glu::CallLogWrapper::glGetError(gl);
    if (local_1bc != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,"Got Error ",&local_241);
      EVar4 = glu::getErrorStr(local_1bc);
      p_Stack_288 = EVar4.m_getName;
      local_280 = EVar4.m_value;
      local_278 = p_Stack_288;
      local_270 = local_280;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_268,&local_278);
      std::operator+(&local_220,&local_240,&local_268);
      std::operator+(&local_200,&local_220,": ");
      std::operator+(&local_1e0,&local_200,"set state");
      tcu::ResultCollector::fail(result,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator(&local_241);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49,
             (this->super_SamplerTest).m_type);
  glu::CallLogWrapper::glSamplerParameterf
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,35402.0);
  do {
    local_28c = glu::CallLogWrapper::glGetError(gl);
    if (local_28c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_310,"Got Error ",&local_311);
      EVar4 = glu::getErrorStr(local_28c);
      p_Stack_358 = EVar4.m_getName;
      local_350 = EVar4.m_value;
      local_348 = p_Stack_358;
      local_340 = local_350;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_338,&local_348);
      std::operator+(&local_2f0,&local_310,&local_338);
      std::operator+(&local_2d0,&local_2f0,": ");
      std::operator+(&local_2b0,&local_2d0,"set state");
      tcu::ResultCollector::fail(result,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_310);
      std::allocator<char>::~allocator(&local_311);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a,
             (this->super_SamplerTest).m_type);
  glu::CallLogWrapper::glSamplerParameterfv
            (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,&local_ec);
  do {
    local_35c = glu::CallLogWrapper::glGetError(gl);
    if (local_35c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e0,"Got Error ",&local_3e1);
      EVar4 = glu::getErrorStr(local_35c);
      _decode = EVar4.m_getName;
      local_420 = EVar4.m_value;
      local_418 = _decode;
      local_410 = local_420;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_408,&local_418);
      std::operator+(&local_3c0,&local_3e0,&local_408);
      std::operator+(&local_3a0,&local_3c0,": ");
      std::operator+(&local_380,&local_3a0,"set state");
      tcu::ResultCollector::fail(result,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_408);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator(&local_3e1);
    }
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  StateQueryUtil::verifyStateSamplerParamInteger
            (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49,
             (this->super_SamplerTest).m_type);
  tcu::ScopedLogSection::~ScopedLogSection(&local_98);
  bVar1 = isPureIntTester((this->super_SamplerTest).m_tester);
  if (bVar1) {
    err_4 = 0x8a4a;
    local_430 = 0x8a49;
    glu::CallLogWrapper::glSamplerParameterIiv
              (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (GLint *)&err_4);
    do {
      local_434 = glu::CallLogWrapper::glGetError(gl);
      if (local_434 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4b8,"Got Error ",&local_4b9);
        EVar4 = glu::getErrorStr(local_434);
        p_Stack_500 = EVar4.m_getName;
        local_4f8 = EVar4.m_value;
        local_4f0 = p_Stack_500;
        local_4e8 = local_4f8;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_4e0,&local_4f0);
        std::operator+(&local_498,&local_4b8,&local_4e0);
        std::operator+(&local_478,&local_498,": ");
        std::operator+(&local_458,&local_478,"glSamplerParameterIiv");
        tcu::ResultCollector::fail(result,&local_458);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::~string((string *)&local_498);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::allocator<char>::~allocator(&local_4b9);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a
               ,(this->super_SamplerTest).m_type);
    glu::CallLogWrapper::glSamplerParameterIiv
              (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,&local_430);
    do {
      local_504 = glu::CallLogWrapper::glGetError(gl);
      if (local_504 != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_588,"Got Error ",&local_589);
        EVar4 = glu::getErrorStr(local_504);
        _decode_1 = EVar4.m_getName;
        local_5c8 = EVar4.m_value;
        local_5c0 = _decode_1;
        local_5b8 = local_5c8;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_5b0,&local_5c0);
        std::operator+(&local_568,&local_588,&local_5b0);
        std::operator+(&local_548,&local_568,": ");
        std::operator+(&local_528,&local_548,"glSamplerParameterIiv");
        tcu::ResultCollector::fail(result,&local_528);
        std::__cxx11::string::~string((string *)&local_528);
        std::__cxx11::string::~string((string *)&local_548);
        std::__cxx11::string::~string((string *)&local_568);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::__cxx11::string::~string((string *)&local_588);
        std::allocator<char>::~allocator(&local_589);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49
               ,(this->super_SamplerTest).m_type);
  }
  bVar1 = isPureUintTester((this->super_SamplerTest).m_tester);
  if (bVar1) {
    err_6 = 0x8a4a;
    local_5d8 = 0x8a49;
    glu::CallLogWrapper::glSamplerParameterIuiv
              (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,&err_6);
    do {
      local_5dc = glu::CallLogWrapper::glGetError(gl);
      if (local_5dc != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_660,"Got Error ",&local_661);
        EVar4 = glu::getErrorStr(local_5dc);
        p_Stack_6a8 = EVar4.m_getName;
        local_6a0 = EVar4.m_value;
        local_698 = p_Stack_6a8;
        local_690 = local_6a0;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_688,&local_698);
        std::operator+(&local_640,&local_660,&local_688);
        std::operator+(&local_620,&local_640,": ");
        std::operator+(&local_600,&local_620,"glSamplerParameterIuiv");
        tcu::ResultCollector::fail(result,&local_600);
        std::__cxx11::string::~string((string *)&local_600);
        std::__cxx11::string::~string((string *)&local_620);
        std::__cxx11::string::~string((string *)&local_640);
        std::__cxx11::string::~string((string *)&local_688);
        std::__cxx11::string::~string((string *)&local_660);
        std::allocator<char>::~allocator(&local_661);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a4a
               ,(this->super_SamplerTest).m_type);
    glu::CallLogWrapper::glSamplerParameterIuiv
              (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,&local_5d8);
    do {
      local_6ac = glu::CallLogWrapper::glGetError(gl);
      if (local_6ac != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_730,"Got Error ",&local_731);
        EVar4 = glu::getErrorStr(local_6ac);
        local_768 = EVar4.m_getName;
        local_760 = EVar4.m_value;
        tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_758,&local_768);
        std::operator+(&local_710,&local_730,&local_758);
        std::operator+(&local_6f0,&local_710,": ");
        std::operator+(&local_6d0,&local_6f0,"glSamplerParameterIuiv");
        tcu::ResultCollector::fail(result,&local_6d0);
        std::__cxx11::string::~string((string *)&local_6d0);
        std::__cxx11::string::~string((string *)&local_6f0);
        std::__cxx11::string::~string((string *)&local_710);
        std::__cxx11::string::~string((string *)&local_758);
        std::__cxx11::string::~string((string *)&local_730);
        std::allocator<char>::~allocator(&local_731);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,0x8a49
               ,(this->super_SamplerTest).m_type);
  }
  return;
}

Assistant:

void SamplerSRGBDecodeCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool isPureCase = isPureIntTester(m_tester) || isPureUintTester(m_tester);

	if (!isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Toggle", "Toggle");
		const glw::GLint			decodeInt		= GL_DECODE_EXT;
		const glw::GLfloat			decodeFloat		= (glw::GLfloat)GL_DECODE_EXT;

		gl.glSamplerParameteri(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glSamplerParameteriv(m_target, m_pname, &decodeInt);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);

		gl.glSamplerParameterf(m_target, m_pname, GL_SKIP_DECODE_EXT);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glSamplerParameterfv(m_target, m_pname, &decodeFloat);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "set state");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureIntTester(m_tester))
	{
		const glw::GLint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLint decode		= GL_DECODE_EXT;

		gl.glSamplerParameterIiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glSamplerParameterIiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}

	if (isPureUintTester(m_tester))
	{
		const glw::GLuint skipDecode	= GL_SKIP_DECODE_EXT;
		const glw::GLuint decode		= GL_DECODE_EXT;

		gl.glSamplerParameterIuiv(m_target, m_pname, &skipDecode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_SKIP_DECODE_EXT, m_type);

		gl.glSamplerParameterIuiv(m_target, m_pname, &decode);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, GL_DECODE_EXT, m_type);
	}
}